

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O3

Aig_Man_t * Aig_ManDupSimpleWithHints(Aig_Man_t *p,Vec_Int_t *vHints)

{
  char *__s;
  void *pvVar1;
  int iVar2;
  Aig_Man_t *p_00;
  size_t sVar3;
  char *__dest;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  Vec_Ptr_t *pVVar6;
  Aig_Obj_t *p1;
  long lVar7;
  
  if ((p->nAsserts != 0) && (p->nConstrs != 0)) {
    __assert_fail("p->nAsserts == 0 || p->nConstrs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                  ,0x70,"Aig_Man_t *Aig_ManDupSimpleWithHints(Aig_Man_t *, Vec_Int_t *)");
  }
  p_00 = Aig_ManStart(p->vObjs->nSize);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar3 = strlen(__s);
    __dest = (char *)malloc(sVar3 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar6 = p->vCis;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar7];
      pAVar4 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      iVar2 = *(int *)((long)pvVar1 + 0x24);
      if (((long)iVar2 < 0) || (vHints->nSize <= iVar2)) goto LAB_005feb40;
      if ((ulong)(uint)vHints->pArray[iVar2] < 2) {
        *(ulong *)((long)pvVar1 + 0x28) = (ulong)(uint)vHints->pArray[iVar2] ^ (ulong)p_00->pConst1;
      }
      lVar7 = lVar7 + 1;
      pVVar6 = p->vCis;
    } while (lVar7 < pVVar6->nSize);
  }
  pVVar6 = p->vObjs;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar7];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_005feb5f;
        uVar5 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        uVar5 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        pAVar4 = Aig_And(p_00,pAVar4,p1);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
        iVar2 = *(int *)((long)pvVar1 + 0x24);
        if (((long)iVar2 < 0) || (vHints->nSize <= iVar2)) {
LAB_005feb40:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((ulong)(uint)vHints->pArray[iVar2] < 2) {
          *(ulong *)((long)pvVar1 + 0x28) =
               (ulong)(uint)vHints->pArray[iVar2] ^ (ulong)p_00->pConst1;
        }
      }
      lVar7 = lVar7 + 1;
      pVVar6 = p->vObjs;
    } while (lVar7 < pVVar6->nSize);
  }
  pVVar6 = p->vCos;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar7];
      if (((ulong)pvVar1 & 1) != 0) {
LAB_005feb5f:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar5 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
      if (uVar5 == 0) {
        pAVar4 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar4 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
      }
      pAVar4 = Aig_ObjCreateCo(p_00,pAVar4);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      lVar7 = lVar7 + 1;
      pVVar6 = p->vCos;
    } while (lVar7 < pVVar6->nSize);
  }
  Aig_ManCleanup(p_00);
  Aig_ManSetRegNum(p_00,p->nRegs);
  iVar2 = Aig_ManCheck(p_00);
  if (iVar2 == 0) {
    puts("Llb_ManDeriveAigWithHints(): The check has failed.");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupSimpleWithHints( Aig_Man_t * p, Vec_Int_t * vHints )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i, Entry;
    assert( p->nAsserts == 0 || p->nConstrs == 0 );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
    {
        pObj->pData = Aig_ObjCreateCi( pNew );
        Entry = Vec_IntEntry( vHints, Aig_ObjId(pObj) );
        if ( Entry == 0 || Entry == 1 )
            pObj->pData = Aig_NotCond( Aig_ManConst1(pNew), Entry ); // restrict to the complement of constraint!!!
    }
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
    {
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        Entry = Vec_IntEntry( vHints, Aig_ObjId(pObj) );
        if ( Entry == 0 || Entry == 1 )
            pObj->pData = Aig_NotCond( Aig_ManConst1(pNew), Entry ); // restrict to the complement of constraint!!!
    }
    // add the POs
    Aig_ManForEachCo( p, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Llb_ManDeriveAigWithHints(): The check has failed.\n" );
    return pNew;
}